

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O2

void __thiscall Diligent::SPIRVShaderResources::~SPIRVShaderResources(SPIRVShaderResources *this)

{
  ushort uVar1;
  ushort uVar2;
  Uint32 n;
  uint uVar3;
  
  for (uVar3 = 0; uVar1 = this->m_StorageBufferOffset, uVar3 < uVar1; uVar3 = uVar3 + 1) {
    GetUB(this,uVar3);
  }
  for (uVar3 = 0; uVar2 = this->m_StorageImageOffset, uVar3 < (uint)uVar2 - (uint)uVar1;
      uVar3 = uVar3 + 1) {
    GetSB(this,uVar3);
    uVar1 = this->m_StorageBufferOffset;
  }
  for (uVar3 = 0; uVar1 = this->m_SampledImageOffset, uVar3 < (uint)uVar1 - (uint)uVar2;
      uVar3 = uVar3 + 1) {
    GetImg(this,uVar3);
    uVar2 = this->m_StorageImageOffset;
  }
  for (uVar3 = 0; uVar2 = this->m_AtomicCounterOffset, uVar3 < (uint)uVar2 - (uint)uVar1;
      uVar3 = uVar3 + 1) {
    GetSmpldImg(this,uVar3);
    uVar1 = this->m_SampledImageOffset;
  }
  for (uVar3 = 0; uVar1 = this->m_SeparateSamplerOffset, uVar3 < (uint)uVar1 - (uint)uVar2;
      uVar3 = uVar3 + 1) {
    GetAC(this,uVar3);
    uVar2 = this->m_AtomicCounterOffset;
  }
  for (uVar3 = 0; uVar2 = this->m_SeparateImageOffset, uVar3 < (uint)uVar2 - (uint)uVar1;
      uVar3 = uVar3 + 1) {
    GetSepSmplr(this,uVar3);
    uVar1 = this->m_SeparateSamplerOffset;
  }
  for (uVar3 = 0; uVar1 = this->m_InputAttachmentOffset, uVar3 < (uint)uVar1 - (uint)uVar2;
      uVar3 = uVar3 + 1) {
    GetSepImg(this,uVar3);
    uVar2 = this->m_SeparateImageOffset;
  }
  for (uVar3 = 0; uVar3 < (uint)this->m_AccelStructOffset - (uint)uVar1; uVar3 = uVar3 + 1) {
    GetInptAtt(this,uVar3);
    uVar1 = this->m_InputAttachmentOffset;
  }
  for (uVar3 = 0; uVar3 < this->m_NumShaderStageInputs; uVar3 = uVar3 + 1) {
    GetShaderStageInputAttribs(this,uVar3);
  }
  for (uVar3 = 0; uVar3 < (uint)this->m_TotalResources - (uint)this->m_AccelStructOffset;
      uVar3 = uVar3 + 1) {
    GetAccelStruct(this,uVar3);
  }
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            (&this->m_UBReflectionBuffer);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            (&this->m_MemoryBuffer);
  return;
}

Assistant:

SPIRVShaderResources::~SPIRVShaderResources()
{
    for (Uint32 n = 0; n < GetNumUBs(); ++n)
        GetUB(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSBs(); ++n)
        GetSB(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumImgs(); ++n)
        GetImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSmpldImgs(); ++n)
        GetSmpldImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumACs(); ++n)
        GetAC(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSepSmplrs(); ++n)
        GetSepSmplr(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSepImgs(); ++n)
        GetSepImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumInptAtts(); ++n)
        GetInptAtt(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumShaderStageInputs(); ++n)
        GetShaderStageInputAttribs(n).~SPIRVShaderStageInputAttribs();

    for (Uint32 n = 0; n < GetNumAccelStructs(); ++n)
        GetAccelStruct(n).~SPIRVShaderResourceAttribs();

    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please add destructor for the new resource");
}